

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry_iterator.cpp
# Opt level: O3

bool __thiscall Pathie::entry_iterator::operator==(entry_iterator *this,entry_iterator *other)

{
  bool bVar1;
  
  if (other->mp_directory == (Path *)0x0) {
    bVar1 = this->mp_cur == (void *)0x0;
  }
  else {
    bVar1 = other->mp_cur == this->mp_cur && other->mp_directory == this->mp_directory;
  }
  return bVar1;
}

Assistant:

bool entry_iterator::operator==(const entry_iterator& other) const
{
  if (other.mp_directory == NULL) {
    /* `mp_directory' is only null for the terminal iterator, that is,
     * a test for the terminal iterator was requested. An entry_iterator
     * is terminated when `mp_cur' is null, so that's what is returned
     * in reality when a test with the terminal iterator is
     * requested. */
    return !mp_cur;
  }
  else {
    return mp_directory == other.mp_directory && mp_cur == other.mp_cur;
  }
}